

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_sort.c
# Opt level: O3

void down_heap(int from,int to)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  iVar1 = arr[from];
  lVar3 = (long)from;
  if (from <= to / 2) {
    do {
      uVar2 = from * 2;
      uVar4 = uVar2;
      if (((int)uVar2 < to) && (uVar4 = uVar2 | 1, arr[(int)uVar2] <= arr[(int)(uVar2 | 1)])) {
        uVar4 = uVar2;
      }
      lVar3 = (long)from;
    } while ((arr[(int)uVar4] < iVar1) &&
            (arr[from] = arr[(int)uVar4], lVar3 = (long)(int)uVar4, from = uVar4,
            (int)uVar4 <= to / 2));
  }
  arr[lVar3] = iVar1;
  return;
}

Assistant:

void down_heap(int from, int to) {
  int val = arr[from];

  int i = from;
  while (i <= to / 2) {
    int j = i * 2;
    if (j + 1 <= to && arr[j] > arr[j + 1]) {
      j++;
    }

    if (val <= arr[j]) {
      break;
    }

    arr[i] = arr[j];
    i = j;
  }

  arr[i] = val;
}